

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_columns.cpp
# Opt level: O3

void __thiscall
duckdb::BaseColumnPruner::AddBinding
          (BaseColumnPruner *this,BoundColumnRefExpression *col,ColumnIndex *child_column)

{
  iterator __position;
  iterator iVar1;
  ReferencedColumn column;
  void *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> vStack_80;
  reference_wrapper<duckdb::BoundColumnRefExpression> local_68;
  idx_t iStack_60;
  void *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> local_40;
  
  iVar1 = ::std::
          _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->column_references)._M_h,&col->binding);
  local_68._M_data = col;
  if (iVar1.
      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
      ._M_cur == (__node_type *)0x0) {
    vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88 = 0;
    vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98 = (void *)0x0;
    uStack_90 = 0;
    ::std::
    vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::BoundColumnRefExpression>>
              ((vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
                *)&local_98,(iterator)0x0,&local_68);
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::
    emplace_back<duckdb::ColumnIndex>(&vStack_80,child_column);
    local_68._M_data = (BoundColumnRefExpression *)(col->binding).table_index;
    iStack_60 = (col->binding).column_index;
    local_58 = local_98;
    uStack_50 = uStack_90;
    local_48 = local_88;
    local_98 = (void *)0x0;
    uStack_90 = 0;
    local_88 = 0;
    local_40.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
         _M_impl.super__Vector_impl_data._M_start._0_4_;
    local_40.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ =
         vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
         _M_impl.super__Vector_impl_data._M_start._4_4_;
    local_40.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
         _M_impl.super__Vector_impl_data._M_finish._0_4_;
    local_40.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
         _M_impl.super__Vector_impl_data._M_finish._4_4_;
    local_40.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_80.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::
    _Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::ReferencedColumn>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::ReferencedColumn>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<duckdb::ColumnBinding,duckdb::ReferencedColumn>>
              ((_Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::ReferencedColumn>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::ReferencedColumn>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->column_references);
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector(&local_40);
    if (local_58 != (void *)0x0) {
      operator_delete(local_58);
    }
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector(&vStack_80);
    if (local_98 != (void *)0x0) {
      operator_delete(local_98);
    }
  }
  else {
    __position._M_current =
         *(reference_wrapper<duckdb::BoundColumnRefExpression> **)
          ((long)iVar1.
                 super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                 ._M_cur + 0x20);
    if (__position._M_current ==
        *(reference_wrapper<duckdb::BoundColumnRefExpression> **)
         ((long)iVar1.
                super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                ._M_cur + 0x28)) {
      ::std::
      vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::BoundColumnRefExpression>>
                ((vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
                  *)((long)iVar1.
                           super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                           ._M_cur + 0x18),__position,&local_68);
    }
    else {
      (__position._M_current)->_M_data = col;
      *(long *)((long)iVar1.
                      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                      ._M_cur + 0x20) =
           *(long *)((long)iVar1.
                           super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                           ._M_cur + 0x20) + 8;
    }
    MergeChildColumns((vector<duckdb::ColumnIndex,_true> *)
                      ((long)iVar1.
                             super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                             ._M_cur + 0x30),child_column);
  }
  return;
}

Assistant:

void BaseColumnPruner::AddBinding(BoundColumnRefExpression &col, ColumnIndex child_column) {
	auto entry = column_references.find(col.binding);
	if (entry == column_references.end()) {
		// column not referenced yet - add a binding to it entirely
		ReferencedColumn column;
		column.bindings.push_back(col);
		column.child_columns.push_back(std::move(child_column));
		column_references.insert(make_pair(col.binding, std::move(column)));
	} else {
		// column reference already exists - check add the binding
		auto &column = entry->second;
		column.bindings.push_back(col);

		MergeChildColumns(column.child_columns, child_column);
	}
}